

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O3

void DefaultFormatter::Ser<DataStream,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               (DataStream *s,vector<unsigned_char,_std::allocator<unsigned_char>_> *t)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  WriteCompactSize<DataStream>
            (s,(long)(t->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(t->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_start);
  if ((t->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (t->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
              ((vector<std::byte,zero_after_free_allocator<std::byte>> *)s,
               (s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
               .super__Vector_impl_data._M_finish);
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void Ser(Stream& s, const T& t) { Serialize(s, t); }